

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void pushstr(BuffFS *buff,char *str,size_t l)

{
  int total;
  byte bVar1;
  int iVar2;
  lua_State *L;
  StkId pTVar3;
  TString *pTVar4;
  char *__assertion;
  
  L = buff->L;
  pTVar3 = L->top;
  pTVar4 = luaS_newlstr(L,str,l);
  if ((pTVar4->tt & 0xe) < 10) {
    (pTVar3->value_).gc = (GCObject *)pTVar4;
    bVar1 = pTVar4->tt;
    pTVar3->tt_ = bVar1 | 0x8000;
    if ((-1 < (char)bVar1) && ((pTVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      iVar2 = buff->pushed;
      total = iVar2 + 1;
      buff->pushed = total;
      if ((0 < iVar2) && (L->stack_last <= pTVar3 + 2)) {
        luaV_concat(L,total);
        buff->pushed = 1;
      }
      return;
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x1a9,"void pushstr(BuffFS *, const char *, size_t)");
}

Assistant:

static void pushstr (BuffFS *buff, const char *str, size_t l) {
  lua_State *L = buff->L;
  setsvalue2s(L, L->top, luaS_newlstr(L, str, l));
  L->top++;  /* may use one extra slot */
  buff->pushed++;
  if (buff->pushed > 1 && L->top + 1 >= L->stack_last) {
    luaV_concat(L, buff->pushed);  /* join all partial results into one */
    buff->pushed = 1;
  }
}